

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskWrite>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskWrite> *this,
               VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  long lVar1;
  ChannelOrder CVar2;
  VkImageCreateInfo *pVVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  float fVar12;
  ConstPixelBufferAccess local_90;
  VkImageCreateInfo *local_68;
  string *local_60;
  string *local_58;
  VkImageCreateInfo *local_50;
  ConstPixelBufferAccess *local_48;
  ulong local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  bVar8 = (imageMSInfo->extent).depth != 0;
  local_90.m_data = __return_storage_ptr__;
  local_68 = imageRSInfo;
  local_58 = (string *)dataPerSample;
  local_48 = dataRS;
  if (bVar8) {
    local_40 = (ulong)imageMSInfo->samples;
    local_60 = (string *)&__return_storage_ptr__->m_description;
    local_38 = &(__return_storage_ptr__->m_description).field_2;
    lVar1 = local_40 * 0x28;
    uVar6 = 0;
    local_50 = imageMSInfo;
    do {
      bVar9 = (imageMSInfo->extent).height != 0;
      if (bVar9) {
        uVar5 = 0;
        do {
          bVar10 = (imageMSInfo->extent).width != 0;
          if (bVar10) {
            uVar4 = 0;
            do {
              if (local_40 != 0) {
                lVar7 = 0;
                do {
                  tcu::ConstPixelBufferAccess::getPixelInt
                            (&local_90,(int)*(undefined8 *)local_58 + (int)lVar7,uVar4,uVar5);
                  CVar2 = local_90.m_format.order;
                  if ((local_90.m_format.order != R) && (local_90.m_format.order != 0xff)) {
                    local_90.m_format = (TextureFormat)(local_90.m_size.m_data + 2);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_90,
                               "Expected color to be zero or saturated on the first channel","");
                    *(qpTestResult *)local_90.m_data = QP_TEST_RESULT_FAIL;
                    (((string *)((long)local_90.m_data + 8))->_M_dataplus)._M_p = (pointer)local_38;
                    std::__cxx11::string::_M_construct<char*>
                              (local_60,local_90.m_format,
                               local_90.m_size.m_data._0_8_ + (long)local_90.m_format);
                    if (local_90.m_format != (TextureFormat)(local_90.m_size.m_data + 2)) {
                      operator_delete((void *)local_90.m_format,local_90._16_8_ + 1);
                    }
                    if ((CVar2 != R) && (CVar2 != 0xff)) {
                      imageMSInfo = local_50;
                      if (!bVar10) goto LAB_004c98df;
                      if (!bVar9) goto LAB_004c98fc;
                      if (bVar8) {
                        return (TestStatus *)local_90.m_data;
                      }
                      goto LAB_004c990c;
                    }
                  }
                  lVar7 = lVar7 + 0x28;
                } while (lVar1 != lVar7);
              }
              uVar4 = uVar4 + 1;
              bVar10 = uVar4 < (local_50->extent).width;
              imageMSInfo = local_50;
            } while (bVar10);
          }
LAB_004c98df:
          uVar5 = uVar5 + 1;
          bVar9 = uVar5 < (imageMSInfo->extent).height;
        } while (bVar9);
      }
LAB_004c98fc:
      uVar6 = uVar6 + 1;
      bVar8 = uVar6 < (imageMSInfo->extent).depth;
    } while (bVar8);
  }
LAB_004c990c:
  bVar8 = (local_68->extent).depth != 0;
  if (bVar8) {
    local_58 = (string *)((long)local_90.m_data + 8);
    local_60 = (string *)&((string *)((long)local_90.m_data + 8))->field_2;
    uVar6 = 0;
    do {
      bVar9 = (local_68->extent).height != 0;
      pVVar3 = local_68;
      if (bVar9) {
        uVar5 = 0;
        do {
          if ((pVVar3->extent).width != 0) {
            uVar4 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel(&local_90,(int)local_48,uVar4,uVar5);
              fVar12 = (float)local_90.m_format.order + -0.5;
              uVar11 = -(uint)(-fVar12 <= fVar12);
              if (0.02 < (float)(~uVar11 & (uint)-fVar12 | (uint)fVar12 & uVar11)) {
                local_90.m_format = (TextureFormat)(local_90.m_size.m_data + 2);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_90,
                           "Expected resolve color to be half intensity on the first channel","");
                *(qpTestResult *)local_90.m_data = QP_TEST_RESULT_FAIL;
                (((string *)((long)local_90.m_data + 8))->_M_dataplus)._M_p = (pointer)local_60;
                std::__cxx11::string::_M_construct<char*>
                          (local_58,local_90.m_format,
                           local_90.m_size.m_data._0_8_ + (long)local_90.m_format);
                if (local_90.m_format != (TextureFormat)(local_90.m_size.m_data + 2)) {
                  operator_delete((void *)local_90.m_format,local_90._16_8_ + 1);
                }
                pVVar3 = local_68;
                if (!bVar9) goto LAB_004c9a2f;
                if (bVar8) {
                  return (TestStatus *)local_90.m_data;
                }
                goto LAB_004c9a46;
              }
              uVar4 = uVar4 + 1;
              pVVar3 = local_68;
            } while (uVar4 < (local_68->extent).width);
          }
          uVar5 = uVar5 + 1;
          bVar9 = uVar5 < (pVVar3->extent).height;
        } while (bVar9);
      }
LAB_004c9a2f:
      uVar6 = uVar6 + 1;
      bVar8 = uVar6 < (pVVar3->extent).depth;
    } while (bVar8);
  }
LAB_004c9a46:
  local_90.m_format = (TextureFormat)(local_90.m_size.m_data + 2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Passed","");
  *(qpTestResult *)local_90.m_data = QP_TEST_RESULT_PASS;
  (((string *)((long)local_90.m_data + 8))->_M_dataplus)._M_p =
       (pointer)&((string *)((long)local_90.m_data + 8))->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)local_90.m_data + 8),local_90.m_format,
             local_90.m_size.m_data._0_8_ + (long)local_90.m_format);
  if (local_90.m_format != (TextureFormat)(local_90.m_size.m_data + 2)) {
    operator_delete((void *)local_90.m_format,local_90._16_8_ + 1);
  }
  return (TestStatus *)local_90.m_data;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSampleMaskWrite>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																					 const vk::VkImageCreateInfo&						imageRSInfo,
																					 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																					 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	const deUint32 numSamples = static_cast<deUint32>(imageMSInfo.samples);

	for (deUint32 z = 0u; z < imageMSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageMSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageMSInfo.extent.width;  ++x)
	{
		for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
		{
			const deUint32 firstComponent = dataPerSample[sampleNdx].getPixelUint(x, y, z)[0];

			if (firstComponent != 0u && firstComponent != 255u)
				return tcu::TestStatus::fail("Expected color to be zero or saturated on the first channel");
		}
	}

	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;  ++x)
	{
		const float firstComponent = dataRS.getPixel(x, y, z)[0];

		if (deFloatAbs(firstComponent - 0.5f) > 0.02f)
			return tcu::TestStatus::fail("Expected resolve color to be half intensity on the first channel");
	}

	return tcu::TestStatus::pass("Passed");
}